

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall mario::EventLoop::loop(EventLoop *this)

{
  pointer ppCVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  Writer *pWVar4;
  int in_ECX;
  ChannelList *__range2;
  pointer ppCVar5;
  EventLoop *local_a0;
  Writer local_98;
  
  assertInLoopThread(this);
  this->_looping = true;
  this->_quit = false;
  bVar2 = 0;
  while ((bVar2 & 1) == 0) {
    ppCVar5 = (this->_activeChannels).
              super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->_activeChannels).
        super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar5) {
      (this->_activeChannels).
      super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar5;
    }
    iVar3 = EPoller::poll((this->_poller)._M_t.
                          super___uniq_ptr_impl<mario::EPoller,_std::default_delete<mario::EPoller>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mario::EPoller_*,_std::default_delete<mario::EPoller>_>
                          .super__Head_base<0UL,_mario::EPoller_*,_false>._M_head_impl,
                          (pollfd *)0x2710,(nfds_t)&this->_activeChannels,in_ECX);
    (this->_pollReturnTime)._microSecondsSinceEpoch = CONCAT44(extraout_var,iVar3);
    ppCVar1 = (this->_activeChannels).
              super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar5 = (this->_activeChannels).
                   super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar5 != ppCVar1; ppCVar5 = ppCVar5 + 1) {
      Channel::handleEvent(*ppCVar5,(Timestamp)(this->_pollReturnTime)._microSecondsSinceEpoch);
    }
    doPendingFunctors(this);
    bVar2 = this->_quit;
  }
  local_98._vptr_Writer = (_func_int **)&PTR__Writer_0012ae60;
  local_98.m_msg = (LogMessage *)0x0;
  local_98.m_level = Info;
  local_98.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
  ;
  local_98.m_line = 0x48;
  local_98.m_func = "void mario::EventLoop::loop()";
  local_98.m_verboseLevel = 0;
  local_98.m_logger = (Logger *)0x0;
  local_98.m_proceed = false;
  local_98.m_messageBuilder.m_logger = (Logger *)0x0;
  local_98.m_messageBuilder.m_containerLogSeperator = "";
  local_98.m_dispatchAction = NormalLog;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar4 = el::base::Writer::construct(&local_98,1,"default");
  pWVar4 = el::base::Writer::operator<<(pWVar4,(char (*) [10])"EventLoop");
  local_a0 = this;
  pWVar4 = el::base::Writer::operator<<(pWVar4,&local_a0);
  el::base::Writer::operator<<(pWVar4,(char (*) [14])" stop looping");
  el::base::Writer::~Writer(&local_98);
  this->_looping = false;
  return;
}

Assistant:

void EventLoop::loop() {
	assertInLoopThread();
	_looping = true;
    _quit = false;

    while (!_quit) {
        _activeChannels.clear();
        _pollReturnTime = _poller->poll(kPollTimeMs, &_activeChannels);
        for (auto channel_p : _activeChannels) {
            channel_p->handleEvent(_pollReturnTime);
        }

        doPendingFunctors();
    }

	LOG(INFO) << "EventLoop" << this << " stop looping";
	_looping = false;
}